

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtl.cpp
# Opt level: O3

void __thiscall RTLsTy::RegisterLib(RTLsTy *this,__tgt_bin_desc *desc)

{
  __tgt_offload_entry **__x;
  _List_node_base *p_Var1;
  pointer pp_Var2;
  _List_node_base *p_Var3;
  list<void_*,_std::allocator<void_*>_> *plVar4;
  _List_node_base **pp_Var5;
  pointer pDVar6;
  pointer __position;
  int iVar7;
  uint uVar8;
  size_type sVar9;
  mapped_type *pmVar10;
  ulong uVar11;
  mapped_type *pmVar12;
  _List_node_base *p_Var13;
  __tgt_offload_entry *p_Var14;
  _List_node_base *p_Var15;
  int32_t *piVar16;
  long lVar17;
  _Node_alloc_type *__alloc;
  long lVar18;
  long lVar19;
  size_t *psVar20;
  __tgt_device_image *p_Var21;
  PendingCtorsDtorsPerLibrary *this_00;
  mutex *__mutex;
  __tgt_offload_entry *p_Var22;
  int iVar23;
  DeviceTy device;
  list<RTLInfoTy,_std::allocator<RTLInfoTy>_> *local_168;
  RTLInfoTy *local_160;
  long local_158;
  pthread_mutex_t *local_150;
  value_type local_148;
  
  local_148._0_8_ = LoadRTLs;
  local_148.RTL = (RTLInfoTy *)0x0;
  local_160 = (RTLInfoTy *)this;
  std::call_once<void(RTLsTy::*)(),RTLsTy*>
            (&this->initFlag,(offset_in_RTLsTy_to_subr *)&local_148,(RTLsTy **)&local_160);
  iVar7 = pthread_mutex_lock((pthread_mutex_t *)&RTLsMtx);
  if (iVar7 == 0) {
    if (0 < desc->NumDeviceImages) {
      __x = &desc->HostEntriesBegin;
      local_168 = &RTLs.AllRTLs;
      lVar17 = 0;
      do {
        p_Var13 = (_List_node_base *)((long)&local_148 + 0x20);
        p_Var21 = desc->DeviceImages + lVar17;
        p_Var15 = (_List_node_base *)local_168;
        do {
          p_Var15 = (((_List_base<RTLInfoTy,_std::allocator<RTLInfoTy>_> *)&p_Var15->_M_next)->
                    _M_impl)._M_node.super__List_node_base._M_next;
          if (p_Var15 == (_List_node_base *)0x10d1e0) goto LAB_00103fac;
          iVar7 = (**(code **)(p_Var15 + 2))(p_Var21);
        } while (iVar7 == 0);
        pp_Var5 = &p_Var15[1]._M_next;
        if (*(char *)&p_Var15[7]._M_next == '\0') {
          local_148.DeviceID = 0xffffffff;
          local_148.RTLDeviceID = -1;
          local_148.IsInit = false;
          local_148.InitFlag._M_once = 0;
          local_148.HasPendingGlobals = false;
          local_148.PendingCtorsDtors._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red
          ;
          local_148.PendingCtorsDtors._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
          local_148.PendingCtorsDtors._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
               (_Base_ptr)0x0;
          local_148.HostDataToTargetMap.
          super__List_base<HostDataToTargetTy,_std::allocator<HostDataToTargetTy>_>._M_impl._M_node.
          _M_size = 0;
          local_148.PendingCtorsDtors._M_t._M_impl._0_8_ = 0;
          local_148.PendingCtorsDtors._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               &local_148.PendingCtorsDtors._M_t._M_impl.super__Rb_tree_header._M_header;
          local_148.ShadowPtrMap._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          local_148.ShadowPtrMap._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
          local_148.ShadowPtrMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
               (_Base_ptr)0x0;
          local_148.PendingCtorsDtors._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          local_148.ShadowPtrMap._M_t._M_impl._0_8_ = 0;
          local_148.ShadowPtrMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               &local_148.ShadowPtrMap._M_t._M_impl.super__Rb_tree_header._M_header;
          local_148.RTL = (RTLInfoTy *)pp_Var5;
          local_148.HostDataToTargetMap.
          super__List_base<HostDataToTargetTy,_std::allocator<HostDataToTargetTy>_>._M_impl._M_node.
          super__List_node_base._M_next = p_Var13;
          local_148.HostDataToTargetMap.
          super__List_base<HostDataToTargetTy,_std::allocator<HostDataToTargetTy>_>._M_impl._M_node.
          super__List_node_base._M_prev = p_Var13;
          local_148.PendingCtorsDtors._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               local_148.PendingCtorsDtors._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          local_148.ShadowPtrMap._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               local_148.ShadowPtrMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          memset(&local_148.ShadowPtrMap._M_t._M_impl.super__Rb_tree_header._M_node_count,0,0x88);
          lVar18 = (long)Devices.super__Vector_base<DeviceTy,_std::allocator<DeviceTy>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)Devices.super__Vector_base<DeviceTy,_std::allocator<DeviceTy>_>._M_impl.
                         super__Vector_impl_data._M_start >> 3;
          lVar19 = lVar18 * -0x5075075075075075;
          std::vector<DeviceTy,_std::allocator<DeviceTy>_>::resize
                    (&Devices,*(int *)((long)(p_Var15 + 1) + 4) + lVar19,&local_148);
          iVar7 = *(int *)((long)(p_Var15 + 1) + 4);
          if (0 < (long)iVar7) {
            piVar16 = &(Devices.super__Vector_base<DeviceTy,_std::allocator<DeviceTy>_>._M_impl.
                        super__Vector_impl_data._M_start)->RTLDeviceID + lVar18 * 2;
            lVar18 = 0;
            do {
              ((DeviceTy *)(piVar16 + -4))->DeviceID = (int)lVar19 + (int)lVar18;
              *piVar16 = (int)lVar18;
              lVar18 = lVar18 + 1;
              piVar16 = piVar16 + 0x46;
            } while (iVar7 != lVar18);
          }
          __position = RTLs.UsedRTLs.super__Vector_base<RTLInfoTy_*,_std::allocator<RTLInfoTy_*>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
          if (RTLs.UsedRTLs.super__Vector_base<RTLInfoTy_*,_std::allocator<RTLInfoTy_*>_>._M_impl.
              super__Vector_impl_data._M_start ==
              RTLs.UsedRTLs.super__Vector_base<RTLInfoTy_*,_std::allocator<RTLInfoTy_*>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            iVar7 = 0;
          }
          else {
            iVar7 = RTLs.UsedRTLs.super__Vector_base<RTLInfoTy_*,_std::allocator<RTLInfoTy_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish[-1]->NumberOfDevices +
                    RTLs.UsedRTLs.super__Vector_base<RTLInfoTy_*,_std::allocator<RTLInfoTy_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish[-1]->Idx;
          }
          *(int *)(p_Var15 + 1) = iVar7;
          *(undefined1 *)&p_Var15[7]._M_next = 1;
          local_160 = (RTLInfoTy *)pp_Var5;
          if (__position ==
              RTLs.UsedRTLs.super__Vector_base<RTLInfoTy_*,_std::allocator<RTLInfoTy_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<RTLInfoTy*,std::allocator<RTLInfoTy*>>::_M_realloc_insert<RTLInfoTy*>
                      ((vector<RTLInfoTy*,std::allocator<RTLInfoTy*>> *)&RTLs.UsedRTLs,
                       (iterator)__position,&local_160);
          }
          else {
            *__position = (RTLInfoTy *)pp_Var5;
            RTLs.UsedRTLs.super__Vector_base<RTLInfoTy_*,_std::allocator<RTLInfoTy_*>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 RTLs.UsedRTLs.super__Vector_base<RTLInfoTy_*,_std::allocator<RTLInfoTy_*>_>._M_impl
                 .super__Vector_impl_data._M_finish + 1;
          }
          std::
          _Rb_tree<void_*,_std::pair<void_*const,_ShadowPtrValTy>,_std::_Select1st<std::pair<void_*const,_ShadowPtrValTy>_>,_std::less<void_*>,_std::allocator<std::pair<void_*const,_ShadowPtrValTy>_>_>
          ::~_Rb_tree(&local_148.ShadowPtrMap._M_t);
          std::
          _Rb_tree<__tgt_bin_desc_*,_std::pair<__tgt_bin_desc_*const,_PendingCtorDtorListsTy>,_std::_Select1st<std::pair<__tgt_bin_desc_*const,_PendingCtorDtorListsTy>_>,_std::less<__tgt_bin_desc_*>,_std::allocator<std::pair<__tgt_bin_desc_*const,_PendingCtorDtorListsTy>_>_>
          ::~_Rb_tree(&local_148.PendingCtorsDtors._M_t);
          p_Var3 = local_148.HostDataToTargetMap.
                   super__List_base<HostDataToTargetTy,_std::allocator<HostDataToTargetTy>_>._M_impl
                   ._M_node.super__List_node_base._M_next;
          while (p_Var3 != p_Var13) {
            p_Var1 = p_Var3->_M_next;
            operator_delete(p_Var3);
            p_Var3 = p_Var1;
          }
        }
        iVar7 = pthread_mutex_lock((pthread_mutex_t *)&TrlTblMtx);
        if (iVar7 != 0) goto LAB_00103fd9;
        sVar9 = std::
                map<__tgt_offload_entry_*,_TranslationTable,_std::less<__tgt_offload_entry_*>,_std::allocator<std::pair<__tgt_offload_entry_*const,_TranslationTable>_>_>
                ::count(&HostEntriesBeginToTransTable,__x);
        if (sVar9 == 0) {
          pmVar10 = std::
                    map<__tgt_offload_entry_*,_TranslationTable,_std::less<__tgt_offload_entry_*>,_std::allocator<std::pair<__tgt_offload_entry_*const,_TranslationTable>_>_>
                    ::operator[](&HostEntriesBeginToTransTable,__x);
          p_Var22 = desc->HostEntriesEnd;
          (pmVar10->HostTable).EntriesBegin = *__x;
          (pmVar10->HostTable).EntriesEnd = p_Var22;
        }
        local_158 = lVar17;
        pmVar10 = std::
                  map<__tgt_offload_entry_*,_TranslationTable,_std::less<__tgt_offload_entry_*>,_std::allocator<std::pair<__tgt_offload_entry_*const,_TranslationTable>_>_>
                  ::operator[](&HostEntriesBeginToTransTable,__x);
        uVar8 = *(uint *)((long)(p_Var15 + 1) + 4);
        uVar11 = (ulong)(*(int *)(p_Var15 + 1) + uVar8);
        if ((ulong)((long)(pmVar10->TargetsTable).
                          super__Vector_base<__tgt_target_table_*,_std::allocator<__tgt_target_table_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(pmVar10->TargetsTable).
                          super__Vector_base<__tgt_target_table_*,_std::allocator<__tgt_target_table_*>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3) < uVar11) {
          local_148._0_8_ = (value_type)0x0;
          std::vector<__tgt_device_image_*,_std::allocator<__tgt_device_image_*>_>::resize
                    (&pmVar10->TargetsImages,uVar11,(value_type *)&local_148);
          local_148._0_8_ = (value_type)0x0;
          std::vector<__tgt_target_table_*,_std::allocator<__tgt_target_table_*>_>::resize
                    (&pmVar10->TargetsTable,uVar11,(value_type *)&local_148);
          uVar8 = *(uint *)((long)(p_Var15 + 1) + 4);
        }
        if (0 < (int)uVar8) {
          lVar17 = (long)*(int *)pp_Var5;
          uVar11 = (ulong)uVar8;
          do {
            pp_Var2 = (pmVar10->TargetsImages).
                      super__Vector_base<__tgt_device_image_*,_std::allocator<__tgt_device_image_*>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            if (pp_Var2[lVar17] != p_Var21) {
              pp_Var2[lVar17] = p_Var21;
              (pmVar10->TargetsTable).
              super__Vector_base<__tgt_target_table_*,_std::allocator<__tgt_target_table_*>_>.
              _M_impl.super__Vector_impl_data._M_start[lVar17] = (__tgt_target_table *)0x0;
            }
            lVar17 = lVar17 + 1;
            uVar11 = uVar11 - 1;
          } while (uVar11 != 0);
        }
        pthread_mutex_unlock((pthread_mutex_t *)&TrlTblMtx);
        lVar17 = local_158;
        local_148._0_8_ = desc;
        if (0 < *(int *)((long)(p_Var15 + 1) + 4)) {
          iVar23 = 0;
          do {
            pDVar6 = Devices.super__Vector_base<DeviceTy,_std::allocator<DeviceTy>_>._M_impl.
                     super__Vector_impl_data._M_start;
            lVar17 = (long)iVar23 + (long)*(int *)pp_Var5;
            __mutex = &Devices.super__Vector_base<DeviceTy,_std::allocator<DeviceTy>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar17].PendingGlobalsMtx;
            iVar7 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
            if (iVar7 != 0) goto LAB_00103fd9;
            pDVar6[lVar17].HasPendingGlobals = true;
            p_Var22 = p_Var21->EntriesBegin;
            p_Var14 = p_Var21->EntriesEnd;
            local_150 = (pthread_mutex_t *)__mutex;
            if (p_Var22 != p_Var14) {
              this_00 = &pDVar6[lVar17].PendingCtorsDtors;
              do {
                if ((p_Var22->flags & 2U) == 0) {
                  if ((p_Var22->flags & 4U) != 0) {
                    pmVar12 = std::
                              map<__tgt_bin_desc_*,_PendingCtorDtorListsTy,_std::less<__tgt_bin_desc_*>,_std::allocator<std::pair<__tgt_bin_desc_*const,_PendingCtorDtorListsTy>_>_>
                              ::operator[](this_00,(key_type *)&local_148);
                    p_Var13 = (_List_node_base *)operator_new(0x18);
                    p_Var13[1]._M_next = (_List_node_base *)p_Var22->addr;
                    std::__detail::_List_node_base::_M_hook(p_Var13);
                    plVar4 = &pmVar12->PendingDtors;
                    goto LAB_00103f69;
                  }
                }
                else {
                  pmVar12 = std::
                            map<__tgt_bin_desc_*,_PendingCtorDtorListsTy,_std::less<__tgt_bin_desc_*>,_std::allocator<std::pair<__tgt_bin_desc_*const,_PendingCtorDtorListsTy>_>_>
                            ::operator[](this_00,(key_type *)&local_148);
                  p_Var13 = (_List_node_base *)operator_new(0x18);
                  p_Var13[1]._M_next = (_List_node_base *)p_Var22->addr;
                  std::__detail::_List_node_base::_M_hook(p_Var13);
                  plVar4 = &pmVar12->PendingCtors;
LAB_00103f69:
                  psVar20 = &(plVar4->super__List_base<void_*,_std::allocator<void_*>_>)._M_impl.
                             _M_node._M_size;
                  *psVar20 = *psVar20 + 1;
                  p_Var14 = p_Var21->EntriesEnd;
                }
                p_Var22 = p_Var22 + 1;
              } while (p_Var22 != p_Var14);
            }
            pthread_mutex_unlock(local_150);
            iVar23 = iVar23 + 1;
            lVar17 = local_158;
          } while (iVar23 < *(int *)((long)(p_Var15 + 1) + 4));
        }
LAB_00103fac:
        lVar17 = lVar17 + 1;
      } while (lVar17 < desc->NumDeviceImages);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&RTLsMtx);
    return;
  }
LAB_00103fd9:
  std::__throw_system_error(iVar7);
}

Assistant:

void RTLsTy::RegisterLib(__tgt_bin_desc *desc) {
  // Attempt to load all plugins available in the system.
  std::call_once(initFlag, &RTLsTy::LoadRTLs, this);

  RTLsMtx.lock();
  // Register the images with the RTLs that understand them, if any.
  for (int32_t i = 0; i < desc->NumDeviceImages; ++i) {
    // Obtain the image.
    __tgt_device_image *img = &desc->DeviceImages[i];

    RTLInfoTy *FoundRTL = NULL;

    // Scan the RTLs that have associated images until we find one that supports
    // the current image.
    for (auto &R : RTLs.AllRTLs) {
      if (!R.is_valid_binary(img)) {
        DP("Image " DPxMOD " is NOT compatible with RTL %s!\n",
            DPxPTR(img->ImageStart), R.RTLName.c_str());
        continue;
      }

      DP("Image " DPxMOD " is compatible with RTL %s!\n",
          DPxPTR(img->ImageStart), R.RTLName.c_str());

      // If this RTL is not already in use, initialize it.
      if (!R.isUsed) {
        // Initialize the device information for the RTL we are about to use.
        DeviceTy device(&R);
        size_t start = Devices.size();
        Devices.resize(start + R.NumberOfDevices, device);
        for (int32_t device_id = 0; device_id < R.NumberOfDevices;
            device_id++) {
          // global device ID
          Devices[start + device_id].DeviceID = start + device_id;
          // RTL local device ID
          Devices[start + device_id].RTLDeviceID = device_id;
        }

        // Initialize the index of this RTL and save it in the used RTLs.
        R.Idx = (RTLs.UsedRTLs.empty())
                    ? 0
                    : RTLs.UsedRTLs.back()->Idx +
                          RTLs.UsedRTLs.back()->NumberOfDevices;
        assert((size_t) R.Idx == start &&
            "RTL index should equal the number of devices used so far.");
        R.isUsed = true;
        RTLs.UsedRTLs.push_back(&R);

        DP("RTL " DPxMOD " has index %d!\n", DPxPTR(R.LibraryHandler), R.Idx);
      }

      // Initialize (if necessary) translation table for this library.
      TrlTblMtx.lock();
      if(!HostEntriesBeginToTransTable.count(desc->HostEntriesBegin)){
        TranslationTable &tt =
            HostEntriesBeginToTransTable[desc->HostEntriesBegin];
        tt.HostTable.EntriesBegin = desc->HostEntriesBegin;
        tt.HostTable.EntriesEnd = desc->HostEntriesEnd;
      }

      // Retrieve translation table for this library.
      TranslationTable &TransTable =
          HostEntriesBeginToTransTable[desc->HostEntriesBegin];

      DP("Registering image " DPxMOD " with RTL %s!\n",
          DPxPTR(img->ImageStart), R.RTLName.c_str());
      RegisterImageIntoTranslationTable(TransTable, R, img);
      TrlTblMtx.unlock();
      FoundRTL = &R;

      // Load ctors/dtors for static objects
      RegisterGlobalCtorsDtorsForImage(desc, img, FoundRTL);

      // if an RTL was found we are done - proceed to register the next image
      break;
    }

    if (!FoundRTL) {
      DP("No RTL found for image " DPxMOD "!\n", DPxPTR(img->ImageStart));
    }
  }
  RTLsMtx.unlock();


  DP("Done registering entries!\n");
}